

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::Duration::Duration(Duration *this,double inNanoseconds,Unit units)

{
  Unit units_local;
  double inNanoseconds_local;
  Duration *this_local;
  
  this->m_inNanoseconds = inNanoseconds;
  this->m_units = units;
  if (this->m_units == Auto) {
    if (1000.0 < this->m_inNanoseconds || this->m_inNanoseconds == 1000.0) {
      if (1000000.0 < this->m_inNanoseconds || this->m_inNanoseconds == 1000000.0) {
        if (1000000000.0 < this->m_inNanoseconds || this->m_inNanoseconds == 1000000000.0) {
          if (60000000000.0 < this->m_inNanoseconds || this->m_inNanoseconds == 60000000000.0) {
            this->m_units = Minutes;
          }
          else {
            this->m_units = Seconds;
          }
        }
        else {
          this->m_units = Milliseconds;
        }
      }
      else {
        this->m_units = Microseconds;
      }
    }
    else {
      this->m_units = Nanoseconds;
    }
  }
  return;
}

Assistant:

explicit Duration(double inNanoseconds, Unit units = Unit::Auto)
        : m_inNanoseconds(inNanoseconds),
        m_units(units) {
        if (m_units == Unit::Auto) {
            if (m_inNanoseconds < s_nanosecondsInAMicrosecond)
                m_units = Unit::Nanoseconds;
            else if (m_inNanoseconds < s_nanosecondsInAMillisecond)
                m_units = Unit::Microseconds;
            else if (m_inNanoseconds < s_nanosecondsInASecond)
                m_units = Unit::Milliseconds;
            else if (m_inNanoseconds < s_nanosecondsInAMinute)
                m_units = Unit::Seconds;
            else
                m_units = Unit::Minutes;
        }

    }